

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswUnique.c
# Opt level: O3

void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  Aig_Man_t *pAVar10;
  
  pAVar10 = p->pAig;
  pVVar5 = p->vDiffPairs;
  iVar4 = pAVar10->nRegs;
  if (pVVar5 == (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    iVar9 = 0x10;
    if (0xe < iVar4 - 1U) {
      iVar9 = iVar4;
    }
    pVVar5->nSize = 0;
    pVVar5->nCap = iVar9;
    if (iVar9 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)iVar9 << 2);
    }
    pVVar5->pArray = piVar6;
    p->vDiffPairs = pVVar5;
  }
  pVVar5->nSize = 0;
  if (iVar4 < 1) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    do {
      uVar3 = pAVar10->nTruePis + iVar9;
      if (((int)uVar3 < 0) || (pAVar10->vCis->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar7 = (long)*(int *)((long)pAVar10->vCis->pArray[uVar3] + 0x24) * (long)p->nFrames;
      pAVar1 = p->pNodeToFrames[lVar7];
      pAVar2 = p->pNodeToFrames[lVar7 + 1];
      if (pAVar1 == pAVar2) {
        pVVar5 = p->vDiffPairs;
        uVar3 = 0;
      }
      else {
        if (pAVar1 != (Aig_Obj_t *)((ulong)pAVar2 ^ 1)) {
          uVar3 = 1;
          uVar8 = 1;
          if (pAVar1 != (Aig_Obj_t *)0x0) {
            uVar8 = ((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1
            ;
          }
          if (pAVar2 != (Aig_Obj_t *)0x0) {
            uVar3 = ((uint)pAVar2 ^ *(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) >> 3) & 1
            ;
          }
          if (uVar8 == uVar3) {
            iVar4 = Ssw_NodesAreEquiv(p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),
                                      (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe));
            pVVar5 = p->vDiffPairs;
            uVar3 = (uint)(iVar4 != 1);
            goto LAB_005f8e06;
          }
        }
        pVVar5 = p->vDiffPairs;
        uVar3 = 1;
      }
LAB_005f8e06:
      Vec_IntPush(pVVar5,uVar3);
      iVar9 = iVar9 + 1;
      pAVar10 = p->pAig;
      iVar4 = pAVar10->nRegs;
    } while (iVar9 < iVar4);
    iVar9 = p->vDiffPairs->nSize;
  }
  if (iVar9 == iVar4) {
    return;
  }
  __assert_fail("Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswUnique.c"
                ,0x46,"void Ssw_UniqueRegisterPairInfo(Ssw_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs computation of signal correspondence with constraints.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_UniqueRegisterPairInfo( Ssw_Man_t * p )
{
    Aig_Obj_t * pObjLo, * pObj0, * pObj1;
    int i, RetValue, Counter;
    if ( p->vDiffPairs == NULL )
        p->vDiffPairs = Vec_IntAlloc( Saig_ManRegNum(p->pAig) );
    Vec_IntClear( p->vDiffPairs );
    Saig_ManForEachLo( p->pAig, pObjLo, i )
    {
        pObj0 = Ssw_ObjFrame( p, pObjLo, 0 );
        pObj1 = Ssw_ObjFrame( p, pObjLo, 1 );
        if ( pObj0 == pObj1 )
            Vec_IntPush( p->vDiffPairs, 0 );
        else if ( pObj0 == Aig_Not(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
//        else
//            Vec_IntPush( p->vDiffPairs, 1 );
        else if ( Aig_ObjPhaseReal(pObj0) != Aig_ObjPhaseReal(pObj1) )
            Vec_IntPush( p->vDiffPairs, 1 );
        else
        {
            RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObj0), Aig_Regular(pObj1) );
            Vec_IntPush( p->vDiffPairs, RetValue!=1 );
        }
    }
    assert( Vec_IntSize(p->vDiffPairs) == Saig_ManRegNum(p->pAig) );
    // count the number of ones
    Counter = 0;
    Vec_IntForEachEntry( p->vDiffPairs, RetValue, i )
        Counter += RetValue;
//    Abc_Print( 1, "The number of different register pairs = %d.\n", Counter );
}